

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O0

void dill_dump(dill_stream_conflict s)

{
  uint *puVar1;
  long lVar2;
  int iVar3;
  long *in_RDI;
  branch_table *t;
  int i;
  int insn_count_1;
  int l_1;
  void *p_1;
  int insn_count;
  int l;
  void *p;
  void *code_limit;
  int native_missing;
  void *base;
  disassemble_info info;
  uint local_4c;
  uint local_48;
  uint *local_40;
  uint local_38;
  uint *local_30;
  uint *local_18;
  undefined1 local_10 [8];
  long *local_8;
  
  local_8 = in_RDI;
  if (((*(long *)in_RDI[1] != *(long *)(in_RDI[1] + 0xd8)) && (*(long *)(in_RDI[1] + 0xd8) != 0)) &&
     (*(long *)(in_RDI[1] + 0xc0) != 0)) {
    puVar1 = *(uint **)(in_RDI[1] + 0xe0);
    local_30 = *(uint **)(in_RDI[1] + 0xd8);
    (**(code **)(*(long *)(in_RDI[1] + 0xc0) + 0x188))(in_RDI,local_10);
    local_38 = 0;
    printf("\nDILL virtual instruction stream\n\n");
    for (; local_30 < puVar1; local_30 = (uint *)((long)local_30 + (long)iVar3)) {
      printf("%p  - %x - ",local_30,(ulong)*local_30);
      iVar3 = (**(code **)(*(long *)(local_8[1] + 0xc0) + 400))(local_8,local_10,local_30);
      printf("\n");
      if (iVar3 == -1) {
        return;
      }
      local_38 = local_38 + 1;
    }
    printf("\nDumped %d virtual instructions\n\n",(ulong)local_38);
  }
  local_18 = *(uint **)local_8[1];
  if (local_18 == (uint *)0x0) {
    local_18 = *(uint **)(local_8[1] + 0xa8);
  }
  if (local_18 == (uint *)0x0) {
    printf("No code to dump\n");
  }
  else {
    iVar3 = (**(code **)(*local_8 + 0x188))(local_8,local_10);
    if (iVar3 == 0) {
      printf("No native disassembler available\n");
    }
    else {
      local_48 = 0;
      if ((*local_8 != *(long *)(local_8[1] + 0xc0)) && (*(long *)(local_8[1] + 0x18) != 0)) {
        local_18 = *(uint **)(local_8[1] + 0x18);
      }
      for (local_40 = local_18; local_40 < *(uint **)(local_8[1] + 8);
          local_40 = (uint *)((long)local_40 + (long)iVar3)) {
        lVar2 = local_8[1];
        for (local_4c = 0; (int)local_4c < *(int *)(lVar2 + 0x28); local_4c = local_4c + 1) {
          if ((long)*(int *)(*(long *)(lVar2 + 0x30) + (long)(int)local_4c * 4) ==
              (long)local_40 - (long)local_18) {
            printf("L%d:\n",(ulong)local_4c);
          }
        }
        if (local_40 == *(uint **)(local_8[1] + 0x18)) {
          printf("Function entry point:\n");
        }
        printf("%p  - %x - ",local_40,(ulong)*local_40);
        iVar3 = (**(code **)(*local_8 + 400))(local_8,local_10,local_40);
        printf("\n");
        if (iVar3 < 1) {
          return;
        }
        local_48 = local_48 + 1;
      }
      printf("\nDumped %d instructions\n\n",(ulong)local_48);
    }
  }
  return;
}

Assistant:

extern void
dill_dump(dill_stream s)
{
    struct disassemble_info info;
    void* base = s->p->code_base;
    int native_missing = 0;

    if ((base != s->p->virtual.code_base) &&
        (s->p->virtual.code_base != NULL) &&
        (s->p->virtual.mach_jump != NULL)) {
        /* Section to dump virtual code base *after* dcg completion */
        /* only do this if we're not currently in the middle of virtual
         * generation */
        void* code_limit = s->p->virtual.cur_ip;
        base = s->p->virtual.code_base;
        s->p->virtual.mach_jump->init_disassembly(s, &info);
        void* p;
        int l;
        int insn_count = 0;
        printf("\nDILL virtual instruction stream\n\n");
        for (p = base; p < code_limit;) {
            printf("%p  - %x - ", p, (unsigned)*(int*)p);
            l = s->p->virtual.mach_jump->print_insn(s, &info, (void*)p);
            printf("\n");
            if (l == -1)
                return;
            p = (char*)p + l;
            insn_count++;
        }
        printf("\nDumped %d virtual instructions\n\n", insn_count);
    }
#if defined(NO_DISASSEMBLER)
    native_missing = 1;
#endif
    base = s->p->code_base;
    if (base == NULL) {
        base = s->p->native.code_base;
    }
    if (base == NULL) {
        printf("No code to dump\n");
        return;
    }
    /* if ((s->j != s->p->virtual.mach_jump) && native_missing) { */
    /*     printf("No native disassembler available\n"); */
    /*     return; */
    /* } */
    (void)native_missing;
    if (s->j->init_disassembly(s, &info) == 0) {
        printf("No native disassembler available\n");
    } else {
        void* p;
        int l;
        int insn_count = 0;
        if ((s->j != s->p->virtual.mach_jump) && (s->p->fp != NULL))
            base = s->p->fp;
        for (p = base; (char*)p < s->p->cur_ip;) {
            int i;
            struct branch_table* t = &s->p->branch_table;
            for (i = 0; i < t->next_label; i++) {
                if (t->label_locs[i] == ((char*)p - (char*)base)) {
                    printf("L%d:\n", i);
                }
            }
            if (p == s->p->fp) {
                printf("Function entry point:\n");
            }
            printf("%p  - %x - ", p, (unsigned)*(int*)p);
            l = s->j->print_insn(s, &info, (void*)p);
            printf("\n");
            if (l <= 0)
                return;
            p = (char*)p + l;
            insn_count++;
        }
        printf("\nDumped %d instructions\n\n", insn_count);
    }
}